

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ninjato.cpp
# Opt level: O2

void __thiscall Ninjato::Ninjato(Ninjato *this,string *n,int t,int spT)

{
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&sStack_88,(string *)n);
  std::operator+(&local_68,"Green Card - Item. Katana: ",n);
  Item::Item(&this->super_Item,&sStack_88,t,spT,4,3,3,3,2,2,4,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&sStack_88);
  (this->super_Item).super_GreenCard.super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_00116568
  ;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->cardText)._M_dataplus._M_p = (pointer)&(this->cardText).field_2;
  (this->cardText)._M_string_length = 0;
  (this->cardText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 4;
  this->tapped = false;
  this->attackBonus = 3;
  this->defenseBonus = 3;
  this->minimumHonor = 3;
  std::operator+(&local_48,"Green Card - Item. Katana: ",&this->name);
  std::__cxx11::string::operator=((string *)&this->cardText,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->effectBonus = 2;
  this->effectCost = 2;
  this->durability = 4;
  return;
}

Assistant:

Ninjato::Ninjato(string n, int t, int spT) : Item{n, t, spT, 4, 3, 3, 3, 2, 2, 4, "Green Card - Item. Katana: " + n}
{
    name = n;
    cost = 4;
    tapped = false;

    attackBonus = 3;
    defenseBonus = 3;
    minimumHonor = 3;
    cardText = "Green Card - Item. Katana: " + name;

    effectBonus = 2;
    effectCost = 2;
    durability = 4;
}